

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O1

Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
yaml::Mapping::getInt
          (Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mapping *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExpectedRef<const_Value,_std::string> value_result;
  undefined1 *local_58;
  size_type local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  undefined1 local_38 [32];
  char local_18;
  
  getValue((ExpectedRef<const_Value,_std::string> *)
           &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
              *)local_38)->value_,this,name);
  if (local_18 == '\0') {
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_38._0_8_,local_38._8_8_ + local_38._0_8_);
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    (__return_storage_ptr__->field_0).value_ = (long)paVar1;
    if (local_58 == &local_48) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           uStack_40;
    }
    else {
      (__return_storage_ptr__->field_0).value_ = (long)local_58;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           CONCAT71(uStack_47,local_48);
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_50;
    local_50 = 0;
    local_48 = 0;
    __return_storage_ptr__->has_value_ = false;
    local_58 = &local_48;
  }
  else {
    Value::getInt_abi_cxx11_(__return_storage_ptr__,(Value *)local_38._0_8_);
  }
  if ((local_18 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Value>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_38)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<long int, std::string> Mapping::getInt(const std::string &name) const {
	const auto value_result = getValue(name);
	if (!value_result)
		return Unexpected(value_result.error());

	return value_result.value().get().getInt();
}